

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

Status __thiscall leveldb::VersionSet::LogAndApply(VersionSet *this,VersionEdit *edit,Mutex *mu)

{
  _Base_ptr *pp_Var1;
  pointer ppVar2;
  __pthread_internal_list *p_Var3;
  long lVar4;
  long *plVar5;
  Env *pEVar6;
  Logger *info_log;
  int iVar7;
  Version *v;
  undefined1 auVar8 [8];
  _Alloc_hider _Var9;
  Env *pEVar10;
  _Base_ptr p_Var11;
  pthread_mutex_t *in_RCX;
  VersionSet *this_00;
  long in_FS_OFFSET;
  string record;
  string new_manifest_file;
  void *local_220;
  undefined1 local_218 [8];
  string local_210;
  undefined1 local_1f0 [32];
  undefined1 local_1d0 [16];
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  undefined8 local_38;
  
  local_38 = *(size_type *)(in_FS_OFFSET + 0x28);
  if (mu[1].mu_.super___mutex_base._M_mutex.__size[0x19] == '\x01') {
    ppVar2 = (pointer)(mu->mu_).super___mutex_base._M_mutex.__data.__list.__next;
    if (ppVar2 < *(pointer *)&(edit->deleted_files_)._M_t._M_impl) {
      __assert_fail("edit->log_number_ >= log_number_",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/version_set.cc"
                    ,0x30c,"Status leveldb::VersionSet::LogAndApply(VersionEdit *, port::Mutex *)");
    }
    if ((edit->compact_pointers_).
        super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
        ._M_impl.super__Vector_impl_data._M_start <= ppVar2) {
      __assert_fail("edit->log_number_ < next_file_number_",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/version_set.cc"
                    ,0x30d,"Status leveldb::VersionSet::LogAndApply(VersionEdit *, port::Mutex *)");
    }
  }
  else {
    p_Var3 = *(__pthread_internal_list **)&(edit->deleted_files_)._M_t._M_impl;
    mu[1].mu_.super___mutex_base._M_mutex.__size[0x19] = '\x01';
    (mu->mu_).super___mutex_base._M_mutex.__data.__list.__next = p_Var3;
  }
  if (mu[1].mu_.super___mutex_base._M_mutex.__size[0x1a] == '\0') {
    lVar4 = *(long *)&(edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header;
    mu[1].mu_.super___mutex_base._M_mutex.__size[0x1a] = '\x01';
    mu[1].mu_.super___mutex_base._M_mutex.__align = lVar4;
  }
  ppVar2 = (edit->compact_pointers_).
           super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  mu[1].mu_.super___mutex_base._M_mutex.__size[0x1b] = '\x01';
  *(pointer *)((long)&mu[1].mu_.super___mutex_base._M_mutex + 8) = ppVar2;
  ppVar2 = (edit->compact_pointers_).
           super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  mu[1].mu_.super___mutex_base._M_mutex.__size[0x1c] = '\x01';
  *(pointer *)((long)&mu[1].mu_.super___mutex_base._M_mutex + 0x10) = ppVar2;
  v = (Version *)operator_new(0xe8);
  v->vset_ = (VersionSet *)edit;
  v->next_ = v;
  v->prev_ = v;
  v->refs_ = 0;
  memset(v->files_,0,0xb0);
  v->file_to_compact_level_ = -1;
  v->compaction_score_ = -1.0;
  v->compaction_level_ = -1;
  Builder::Builder((Builder *)local_1d0,(VersionSet *)edit,
                   *(Version **)((long)&edit[2].comparator_.field_2 + 8));
  Builder::Apply((Builder *)local_1d0,(VersionEdit *)mu);
  Builder::SaveTo((Builder *)local_1d0,v);
  this_00 = (VersionSet *)local_1d0;
  Builder::~Builder((Builder *)this_00);
  Finalize(this_00,v);
  local_1d0._0_8_ = &stack0xfffffffffffffe40;
  local_1d0._8_8_ = (Version *)0x0;
  local_1c0 = '\0';
  this->env_ = (Env *)0x0;
  if ((edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left == (_Base_ptr)0x0)
  {
    if ((edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
        (_Base_ptr)0x0) goto LAB_0066bb95;
    DescriptorFileName((string *)local_1f0,(string *)&(edit->comparator_)._M_string_length,
                       (uint64_t)
                       (edit->compact_pointers_).
                       super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    pp_Var1 = &(edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0);
    if ((Env *)local_1f0._0_8_ != (Env *)(local_1f0 + 0x10)) {
      operator_delete((void *)local_1f0._0_8_,CONCAT71(local_1f0._17_7_,local_1f0[0x10]) + 1);
    }
    ppVar2 = (edit->compact_pointers_).
             super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    mu[1].mu_.super___mutex_base._M_mutex.__size[0x1b] = '\x01';
    *(pointer *)((long)&mu[1].mu_.super___mutex_base._M_mutex + 8) = ppVar2;
    plVar5 = (long *)(edit->comparator_)._M_dataplus._M_p;
    (**(code **)(*plVar5 + 0x20))(local_1f0,plVar5,local_1d0,pp_Var1);
    pEVar6 = this->env_;
    this->env_ = (Env *)local_1f0._0_8_;
    pEVar10 = (Env *)local_1f0._0_8_;
    local_1f0._0_8_ = pEVar6;
    if (pEVar6 != (Env *)0x0) {
      operator_delete__(pEVar6);
      pEVar10 = this->env_;
    }
    if (pEVar10 == (Env *)0x0) {
      p_Var11 = (_Base_ptr)operator_new(0x20);
      log::Writer::Writer((Writer *)p_Var11,(WritableFile *)*pp_Var1);
      (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var11;
      WriteSnapshot((VersionSet *)local_1f0,(Writer *)edit);
      pEVar6 = this->env_;
      this->env_ = (Env *)local_1f0._0_8_;
      local_1f0._0_8_ = pEVar6;
      if (pEVar6 != (Env *)0x0) {
        operator_delete__(pEVar6);
      }
    }
  }
  pthread_mutex_unlock(in_RCX);
  if (this->env_ == (Env *)0x0) {
    local_1f0._0_8_ = local_1f0 + 0x10;
    local_1f0._8_8_ = (pointer)0x0;
    local_1f0[0x10] = '\0';
    VersionEdit::EncodeTo((VersionEdit *)mu,(string *)local_1f0);
    local_210._M_dataplus._M_p = (pointer)local_1f0._0_8_;
    local_210._M_string_length = local_1f0._8_8_;
    log::Writer::AddRecord
              ((Writer *)local_218,
               (Slice *)(edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
    ;
    pEVar6 = this->env_;
    this->env_ = (Env *)local_218;
    auVar8 = local_218;
    local_218 = (undefined1  [8])pEVar6;
    if (pEVar6 != (Env *)0x0) {
      operator_delete__(pEVar6);
      auVar8 = (undefined1  [8])this->env_;
    }
    if (auVar8 == (undefined1  [8])0x0) {
      (**(code **)(*(long *)(edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header.
                            _M_parent + 0x28))(&local_210);
      pEVar6 = this->env_;
      this->env_ = (Env *)local_210._M_dataplus._M_p;
      _Var9._M_p = local_210._M_dataplus._M_p;
      local_210._M_dataplus._M_p = (pointer)pEVar6;
      if (pEVar6 != (Env *)0x0) {
        operator_delete__(pEVar6);
        _Var9._M_p = (pointer)this->env_;
      }
      if ((Env *)_Var9._M_p != (Env *)0x0) goto LAB_0066b97b;
    }
    else {
LAB_0066b97b:
      info_log = *(Logger **)(edit->prev_log_number_ + 0x18);
      Status::ToString_abi_cxx11_(&local_210,(Status *)this);
      Log(info_log,"MANIFEST write: %s\n",local_210._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
    }
    if ((Env *)local_1f0._0_8_ != (Env *)(local_1f0 + 0x10)) {
      operator_delete((void *)local_1f0._0_8_,CONCAT71(local_1f0._17_7_,local_1f0[0x10]) + 1);
    }
    if ((this->env_ == (Env *)0x0) && ((Version *)local_1d0._8_8_ != (Version *)0x0)) {
      SetCurrentFile((leveldb *)local_1f0,(Env *)(edit->comparator_)._M_dataplus._M_p,
                     (string *)&(edit->comparator_)._M_string_length,
                     (uint64_t)
                     (edit->compact_pointers_).
                     super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
      pEVar6 = this->env_;
      this->env_ = (Env *)local_1f0._0_8_;
      local_1f0._0_8_ = pEVar6;
      if (pEVar6 != (Env *)0x0) {
        operator_delete__(pEVar6);
      }
    }
  }
  iVar7 = pthread_mutex_lock(in_RCX);
  if (iVar7 == 0) {
    if (this->env_ == (Env *)0x0) {
      AppendVersion((VersionSet *)edit,v);
      lVar4 = mu[1].mu_.super___mutex_base._M_mutex.__align;
      *(__pthread_internal_list **)&(edit->deleted_files_)._M_t._M_impl =
           (mu->mu_).super___mutex_base._M_mutex.__data.__list.__next;
      *(long *)&(edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header = lVar4;
    }
    else {
      Version::~Version(v);
      operator_delete(v,0xe8);
      if ((Version *)local_1d0._8_8_ != (Version *)0x0) {
        p_Var11 = (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if (p_Var11 != (_Base_ptr)0x0) {
          log::Writer::~Writer((Writer *)p_Var11);
        }
        operator_delete(p_Var11,0x20);
        p_Var11 = (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (p_Var11 != (_Base_ptr)0x0) {
          (**(code **)(*(long *)p_Var11 + 8))();
        }
        (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0
        ;
        plVar5 = (long *)(edit->comparator_)._M_dataplus._M_p;
        (**(code **)(*plVar5 + 0x40))(&local_220,plVar5,local_1d0);
        if (local_220 != (void *)0x0) {
          operator_delete__(local_220);
        }
      }
    }
    if ((VersionSet *)local_1d0._0_8_ != (VersionSet *)&stack0xfffffffffffffe40) {
      operator_delete((void *)local_1d0._0_8_,CONCAT71(uStack_1bf,local_1c0) + 1);
    }
    if (*(size_type *)(in_FS_OFFSET + 0x28) == local_38) {
      return (Status)(char *)this;
    }
  }
  else if (*(size_type *)(in_FS_OFFSET + 0x28) == local_38) {
    std::__throw_system_error(iVar7);
LAB_0066bb95:
    __assert_fail("descriptor_file_ == nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/version_set.cc"
                  ,0x328,"Status leveldb::VersionSet::LogAndApply(VersionEdit *, port::Mutex *)");
  }
  __stack_chk_fail();
}

Assistant:

Status VersionSet::LogAndApply(VersionEdit* edit, port::Mutex* mu) {
  if (edit->has_log_number_) {
    assert(edit->log_number_ >= log_number_);
    assert(edit->log_number_ < next_file_number_);
  } else {
    edit->SetLogNumber(log_number_);
  }

  if (!edit->has_prev_log_number_) {
    edit->SetPrevLogNumber(prev_log_number_);
  }

  edit->SetNextFile(next_file_number_);
  edit->SetLastSequence(last_sequence_);

  Version* v = new Version(this);
  {
    Builder builder(this, current_);
    builder.Apply(edit);
    builder.SaveTo(v);
  }
  Finalize(v);

  // Initialize new descriptor log file if necessary by creating
  // a temporary file that contains a snapshot of the current version.
  std::string new_manifest_file;
  Status s;
  if (descriptor_log_ == nullptr) {
    // No reason to unlock *mu here since we only hit this path in the
    // first call to LogAndApply (when opening the database).
    assert(descriptor_file_ == nullptr);
    new_manifest_file = DescriptorFileName(dbname_, manifest_file_number_);
    edit->SetNextFile(next_file_number_);
    s = env_->NewWritableFile(new_manifest_file, &descriptor_file_);
    if (s.ok()) {
      descriptor_log_ = new log::Writer(descriptor_file_);
      s = WriteSnapshot(descriptor_log_);
    }
  }

  // Unlock during expensive MANIFEST log write
  {
    mu->Unlock();

    // Write new record to MANIFEST log
    if (s.ok()) {
      std::string record;
      edit->EncodeTo(&record);
      s = descriptor_log_->AddRecord(record);
      if (s.ok()) {
        s = descriptor_file_->Sync();
      }
      if (!s.ok()) {
        Log(options_->info_log, "MANIFEST write: %s\n", s.ToString().c_str());
      }
    }

    // If we just created a new descriptor file, install it by writing a
    // new CURRENT file that points to it.
    if (s.ok() && !new_manifest_file.empty()) {
      s = SetCurrentFile(env_, dbname_, manifest_file_number_);
    }

    mu->Lock();
  }

  // Install the new version
  if (s.ok()) {
    AppendVersion(v);
    log_number_ = edit->log_number_;
    prev_log_number_ = edit->prev_log_number_;
  } else {
    delete v;
    if (!new_manifest_file.empty()) {
      delete descriptor_log_;
      delete descriptor_file_;
      descriptor_log_ = nullptr;
      descriptor_file_ = nullptr;
      env_->DeleteFile(new_manifest_file);
    }
  }

  return s;
}